

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void pbrt::ReportThreadStats(void)

{
  long lVar1;
  PixelStatsAccumulator local_10;
  
  std::mutex::lock(&ReportThreadStats::mutex);
  StatRegisterer::CallCallbacks((StatsAccumulator *)&statsAccumulator);
  if (pixelStatsEnabled == '\x01') {
    lVar1 = threadStatsState();
    StatsAccumulator::AccumulatePixelStats
              ((StatsAccumulator *)&statsAccumulator,(PixelStatsAccumulator *)(lVar1 + 0x18));
    PixelStatsAccumulator::PixelStatsAccumulator(&local_10);
    lVar1 = threadStatsState();
    *(PixelStats **)(lVar1 + 0x18) = local_10.stats;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&ReportThreadStats::mutex);
  return;
}

Assistant:

void StatsAccumulator::ReportRareCheck(const char *condition, Float maxFrequency,
                                       int64_t numTrue, int64_t total) {
    if (stats->rareChecks.find(condition) == stats->rareChecks.end())
        stats->rareChecks[condition] = Stats::RareCheck(maxFrequency);
    Stats::RareCheck &rc = stats->rareChecks[condition];
    rc.numTrue += numTrue;
    rc.total += total;
}